

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.c
# Opt level: O2

void gc_acc_twist_log(gc_acc_twist *xdd)

{
  vector3 *pvVar1;
  
  if (xdd == (gc_acc_twist *)0x0) {
    __assert_fail("xdd",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/geometry.c"
                  ,0x1bc,"void gc_acc_twist_log(const struct gc_acc_twist *)");
  }
  pvVar1 = xdd->angular_acceleration;
  if ((pvVar1 != (vector3 *)0x0) && (xdd->linear_acceleration != (vector3 *)0x0)) {
    printf("AccelerationCoord(angular=[%5.2f, %5.2f, %5.2f],\n",(pvVar1->field_0).field_0.x,
           (pvVar1->field_0).field_0.y,(pvVar1->field_0).field_0.z);
    pvVar1 = xdd->linear_acceleration;
    printf("                  linear =[%5.2f, %5.2f, %5.2f])\n",(pvVar1->field_0).field_0.x,
           (pvVar1->field_0).field_0.y,(pvVar1->field_0).field_0.z);
    return;
  }
  __assert_fail("xdd->angular_acceleration && xdd->linear_acceleration",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/geometry.c"
                ,0x1bd,"void gc_acc_twist_log(const struct gc_acc_twist *)");
}

Assistant:

void gc_acc_twist_log(
        const struct gc_acc_twist *xdd)
{
    assert(xdd);
    assert(xdd->angular_acceleration && xdd->linear_acceleration);

    printf("AccelerationCoord(angular=[%5.2f, %5.2f, %5.2f],\n",
            xdd->angular_acceleration->x,
            xdd->angular_acceleration->y,
            xdd->angular_acceleration->z);
    printf("                  linear =[%5.2f, %5.2f, %5.2f])\n",
            xdd->linear_acceleration->x,
            xdd->linear_acceleration->y,
            xdd->linear_acceleration->z);
}